

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyUniformValue4f
               (TestContext *testCtx,CallLogWrapper *gl,GLuint program,GLint location,float x,
               float y,float z,float w)

{
  float location_00;
  float program_00;
  CallLogWrapper *this;
  bool bVar1;
  qpTestResult qVar2;
  float (*pafVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  MessageBuilder local_1e0;
  undefined1 local_60 [8];
  StateQueryMemoryWriteGuard<float[4]> state;
  float w_local;
  float z_local;
  float y_local;
  float x_local;
  GLint location_local;
  GLuint program_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  state.m_postguard[2] = w;
  state.m_postguard[3] = z;
  w_local = y;
  z_local = x;
  y_local = (float)location;
  x_local = (float)program;
  _location_local = gl;
  gl_local = (CallLogWrapper *)testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<float[4]> *)local_60);
  this = _location_local;
  program_00 = x_local;
  location_00 = y_local;
  pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_60);
  glu::CallLogWrapper::glGetUniformfv(this,(GLuint)program_00,(GLint)location_00,*pafVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<float[4]> *)local_60,(TestContext *)gl_local);
  if (bVar1) {
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
    if (((*pafVar3)[0] == z_local) && (!NAN((*pafVar3)[0]) && !NAN(z_local))) {
      pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
      if (((*pafVar3)[1] == w_local) && (!NAN((*pafVar3)[1]) && !NAN(w_local))) {
        pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
        if (((*pafVar3)[2] == state.m_postguard[3]) &&
           (!NAN((*pafVar3)[2]) && !NAN(state.m_postguard[3]))) {
          pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
          if (((*pafVar3)[3] == state.m_postguard[2]) &&
             (!NAN((*pafVar3)[3]) && !NAN(state.m_postguard[2]))) {
            return;
          }
        }
      }
    }
    this_00 = tcu::TestContext::getLog((TestContext *)gl_local);
    tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [21])"// ERROR: expected [");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&z_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&w_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,state.m_postguard + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [9])"]; got [");
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 1);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 2);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    pafVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_60);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,*pafVar3 + 3);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    qVar2 = tcu::TestContext::getTestResult((TestContext *)gl_local);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"Got invalid uniform value");
    }
  }
  return;
}

Assistant:

void verifyUniformValue4f (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLuint program, GLint location, float x, float y, float z, float w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> state;
	gl.glGetUniformfv(program, location, state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state[0] != x ||
		state[1] != y ||
		state[2] != z ||
		state[3] != w)
	{
		testCtx.getLog() << TestLog::Message
		<< "// ERROR: expected ["
		<< x << ", "
		<< y << ", "
		<< z << ", "
		<< w
		<< "]; got ["
		<< state[0] << ", "
		<< state[1] << ", "
		<< state[2] << ", "
		<< state[3]
		<< "]"
		<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid uniform value");
	}
}